

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void set_dstarg_writemask(DestArgInfo *dst,int mask)

{
  int mask_local;
  DestArgInfo *dst_local;
  
  dst->writemask = mask;
  dst->writemask0 = mask & 1;
  dst->writemask1 = mask >> 1 & 1;
  dst->writemask2 = mask >> 2 & 1;
  dst->writemask3 = mask >> 3 & 1;
  return;
}

Assistant:

static inline void set_dstarg_writemask(DestArgInfo *dst, const int mask)
{
    dst->writemask = mask;
    dst->writemask0 = ((mask >> 0) & 1);
    dst->writemask1 = ((mask >> 1) & 1);
    dst->writemask2 = ((mask >> 2) & 1);
    dst->writemask3 = ((mask >> 3) & 1);
}